

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::Section::Section(Section *this,SourceLineInfo *_lineInfo,StringRef _name,char *param_3)

{
  size_t sVar1;
  int iVar2;
  IResultCapture *pIVar3;
  uint64_t uVar4;
  StringRef local_70;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined8 local_2f;
  undefined4 local_27;
  undefined2 local_23;
  char local_21;
  
  local_40 = &local_30;
  (this->m_info).name._M_dataplus._M_p = (pointer)&(this->m_info).name.field_2;
  (this->m_info).name.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(this->m_info).name.field_2 + 1) = local_2f;
  *(undefined4 *)((long)&(this->m_info).name.field_2 + 9) = local_27;
  *(undefined2 *)((long)&(this->m_info).name.field_2 + 0xd) = local_23;
  (this->m_info).name.field_2._M_local_buf[0xf] = local_21;
  (this->m_info).name._M_string_length = 0;
  local_38 = 0;
  local_30 = 0;
  (this->m_info).lineInfo.file = "invalid";
  (this->m_info).lineInfo.line = 0xffffffffffffffff;
  local_70.m_start = _name.m_start;
  local_70.m_size = _name.m_size;
  std::__cxx11::string::~string((string *)&local_40);
  (this->m_assertions).failedButOk = 0;
  (this->m_assertions).skipped = 0;
  (this->m_assertions).passed = 0;
  (this->m_assertions).failed = 0;
  pIVar3 = getResultCapture();
  iVar2 = (*pIVar3->_vptr_IResultCapture[3])
                    (pIVar3,_name.m_start,_name.m_size,_lineInfo,&this->m_assertions);
  this->m_sectionIncluded = SUB41(iVar2,0);
  (this->m_timer).m_nanoseconds = 0;
  if (SUB41(iVar2,0) != false) {
    StringRef::operator_cast_to_string(&local_60,&local_70);
    std::__cxx11::string::operator=((string *)this,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    sVar1 = _lineInfo->line;
    (this->m_info).lineInfo.file = _lineInfo->file;
    (this->m_info).lineInfo.line = sVar1;
    uVar4 = std::chrono::_V2::system_clock::now();
    (this->m_timer).m_nanoseconds = uVar4;
  }
  return;
}

Assistant:

Section::Section( SourceLineInfo const& _lineInfo,
                      StringRef _name,
                      const char* const ):
        m_info( { "invalid", static_cast<std::size_t>( -1 ) }, std::string{} ),
        m_sectionIncluded(
            getResultCapture().sectionStarted( _name, _lineInfo, m_assertions ) ) {
        // We delay initialization the SectionInfo member until we know
        // this section needs it, so we avoid allocating std::string for name.
        // We also delay timer start to avoid the potential syscall unless we
        // will actually use the result.
        if ( m_sectionIncluded ) {
            m_info.name = static_cast<std::string>( _name );
            m_info.lineInfo = _lineInfo;
            m_timer.start();
        }
    }